

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O0

void __thiscall
icu_63::UTF8CollationIterator::forwardNumCodePoints
          (UTF8CollationIterator *this,int32_t num,UErrorCode *param_2)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  int local_24;
  uint8_t __t1;
  uint8_t __b;
  int32_t __N;
  UErrorCode *param_2_local;
  int32_t num_local;
  UTF8CollationIterator *this_local;
  
  local_24 = num;
  while( true ) {
    bVar4 = false;
    if (((0 < local_24) && (bVar4 = true, this->length <= this->pos)) &&
       (bVar4 = false, this->length < 0)) {
      bVar4 = this->u8[this->pos] != '\0';
    }
    if (!bVar4) break;
    iVar3 = this->pos;
    this->pos = iVar3 + 1;
    bVar1 = this->u8[iVar3];
    if (((byte)(bVar1 + 0x3e) < 0x33) && (this->pos != this->length)) {
      bVar2 = this->u8[this->pos];
      if ((bVar1 < 0xe0) || (0xef < bVar1)) {
        if (bVar1 < 0xe0) {
          if ((char)bVar2 < -0x40) {
            this->pos = this->pos + 1;
          }
        }
        else if (((((int)""[(int)(uint)bVar2 >> 4] & 1 << (bVar1 & 7)) != 0) &&
                 (iVar3 = this->pos + 1, this->pos = iVar3, iVar3 != this->length)) &&
                (((char)this->u8[this->pos] < -0x40 &&
                 ((iVar3 = this->pos + 1, this->pos = iVar3, iVar3 != this->length &&
                  ((char)this->u8[this->pos] < -0x40)))))) {
          this->pos = this->pos + 1;
        }
      }
      else if (((((int)" 000000000000\x1000"[(int)(bVar1 & 0xf)] &
                 1 << (sbyte)((int)(uint)bVar2 >> 5)) != 0) &&
               (iVar3 = this->pos + 1, this->pos = iVar3, iVar3 != this->length)) &&
              ((char)this->u8[this->pos] < -0x40)) {
        this->pos = this->pos + 1;
      }
    }
    local_24 = local_24 + -1;
  }
  return;
}

Assistant:

void
UTF8CollationIterator::forwardNumCodePoints(int32_t num, UErrorCode & /*errorCode*/) {
    U8_FWD_N(u8, pos, length, num);
}